

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  ulong *puVar1;
  pointer pOVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pcVar5;
  Option *option;
  pointer pAVar6;
  pointer pOVar7;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  iterator __begin1;
  pointer pOVar11;
  ulong uVar12;
  long lVar13;
  string flag;
  __string_type __str;
  string line;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  pAVar6 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arguments_).
      super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar6) {
    lVar13 = 0x20;
    uVar12 = 0;
    do {
      uVar10 = (ulong)*(uint *)((long)&(pAVar6->name)._M_dataplus._M_p + lVar13);
      if (uVar10 < 3) {
        printf(&DAT_0014ccf4 + *(int *)(&DAT_0014ccf4 + uVar10 * 4),
               *(undefined8 *)((long)pAVar6 + lVar13 + -0x20));
      }
      uVar12 = uVar12 + 1;
      pAVar6 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x50;
    } while (uVar12 < (ulong)(((long)(this->arguments_).
                                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 4)
                             * -0x3333333333333333));
  }
  puts("\n");
  puts((this->description_)._M_dataplus._M_p);
  puts("options:");
  pOVar11 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->options_).
           super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar11 != pOVar2) {
    uVar12 = 0;
    pOVar7 = pOVar11;
    do {
      sVar3 = (pOVar7->long_name)._M_string_length;
      if (sVar3 != 0) {
        sVar4 = (pOVar7->metavar)._M_string_length;
        lVar13 = sVar4 + 1;
        if (sVar4 == 0) {
          lVar13 = 0;
        }
        uVar10 = lVar13 + sVar3;
        if (uVar12 < uVar10) {
          uVar12 = uVar10;
        }
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar2);
    if (pOVar11 != pOVar2) {
      do {
        if ((pOVar11->short_name != '\0') || ((pOVar11->long_name)._M_string_length != 0)) {
          local_50 = &local_40;
          local_48 = 0;
          local_40 = '\0';
          if (pOVar11->short_name == '\0') {
            std::__cxx11::string::append((char *)&local_50);
          }
          else {
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"  -","");
            plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_70,local_68,0,'\x01');
            plVar9 = plVar8 + 2;
            if ((long *)*plVar8 == plVar9) {
              local_a0 = *plVar9;
              lStack_98 = plVar8[3];
              local_b0 = &local_a0;
            }
            else {
              local_a0 = *plVar9;
              local_b0 = (long *)*plVar8;
            }
            local_a8 = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
            puVar1 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar1) {
              local_80 = *puVar1;
              lStack_78 = plVar9[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar1;
              local_90 = (ulong *)*plVar9;
            }
            local_88 = plVar9[1];
            *plVar9 = (long)puVar1;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
            if (local_90 != &local_80) {
              operator_delete(local_90,local_80 + 1);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,local_a0 + 1);
            }
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
          }
          local_88 = 0;
          local_80 = local_80 & 0xffffffffffffff00;
          local_90 = &local_80;
          if ((pOVar11->long_name)._M_string_length != 0) {
            std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x14cbd8);
            if ((pOVar11->metavar)._M_string_length == 0) {
              std::__cxx11::string::_M_append
                        ((char *)&local_90,(ulong)(pOVar11->long_name)._M_dataplus._M_p);
            }
            else {
              pcVar5 = (pOVar11->long_name)._M_dataplus._M_p;
              local_70 = local_60;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,pcVar5,pcVar5 + (pOVar11->long_name)._M_string_length);
              std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
              plVar8 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_70,
                                          (ulong)(pOVar11->metavar)._M_dataplus._M_p);
              plVar9 = plVar8 + 2;
              if ((long *)*plVar8 == plVar9) {
                local_a0 = *plVar9;
                lStack_98 = plVar8[3];
                local_b0 = &local_a0;
              }
              else {
                local_a0 = *plVar9;
                local_b0 = (long *)*plVar8;
              }
              local_a8 = plVar8[1];
              *plVar8 = (long)plVar9;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
              if (local_b0 != &local_a0) {
                operator_delete(local_b0,local_a0 + 1);
              }
              if (local_70 != local_60) {
                operator_delete(local_70,local_60[0] + 1);
              }
            }
          }
          local_70 = local_60;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_70,((char)uVar12 + '\n') - (char)local_88);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
          plVar9 = plVar8 + 2;
          if ((long *)*plVar8 == plVar9) {
            local_a0 = *plVar9;
            lStack_98 = plVar8[3];
            local_b0 = &local_a0;
          }
          else {
            local_a0 = *plVar9;
            local_b0 = (long *)*plVar8;
          }
          local_a8 = plVar8[1];
          *plVar8 = (long)plVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0);
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          if ((pOVar11->help)._M_string_length != 0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_50,(ulong)(pOVar11->help)._M_dataplus._M_p);
          }
          puts(local_50);
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
        }
        pOVar11 = pOVar11 + 1;
      } while (pOVar11 != pOVar2);
    }
  }
  return;
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;

      case ArgumentCount::ZeroOrMore:
        printf(" [%s]...", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}